

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O1

RGB __thiscall RayTracer::processPixel(RayTracer *this,Segment *ray,int recursionLevel)

{
  RGB RVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined1 local_48 [8];
  pair<int,_Point> planeIntersection;
  pair<int,_Point> sphereIntersection;
  
  join_0x00001200_0x00000000_ =
       findClosestIntersection<Sphere>(&(this->super_RayTracerBase).config.spheres,ray);
  _local_48 = findClosestIntersection<Plane>(&(this->super_RayTracerBase).config.planes,ray);
  RVar1.r = '\0';
  RVar1.g = '\0';
  RVar1.b = '\0';
  if (((uint)planeIntersection.second.y & local_48._0_4_) != 0xffffffff) {
    if (planeIntersection.second.y == -NAN || local_48._0_4_ == 0xffffffff) {
      bVar2 = planeIntersection.second.y != -NAN;
    }
    else {
      fVar3 = distance(&ray->a,(Point *)&planeIntersection.second.z);
      fVar4 = distance(&ray->a,(Point *)(local_48 + 4));
      bVar2 = fVar3 < fVar4;
    }
    if (bVar2) {
      RVar1 = processPixelOnSphere
                        (this,&ray->a,(Point *)&planeIntersection.second.z,
                         (this->super_RayTracerBase).config.spheres.
                         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)planeIntersection.second.y,
                         recursionLevel);
    }
    else {
      RVar1 = processPixelOnPlane(this,&ray->a,(Point *)(local_48 + 4),
                                  (this->super_RayTracerBase).config.planes.
                                  super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                  super__Vector_impl_data._M_start + (int)local_48._0_4_,
                                  recursionLevel);
    }
  }
  return RVar1;
}

Assistant:

RGB RayTracer::processPixel(Segment const& ray, int recursionLevel)
{
  std::pair<int, Point> sphereIntersection = findClosestIntersection(config.spheres, ray);
  std::pair<int, Point> planeIntersection = findClosestIntersection(config.planes, ray);

  if (sphereIntersection.first == -1 && planeIntersection.first == -1)
    return processPixelOnBackground();

  auto closerIntersectionCmp = [&ray](std::pair<int, Point> const& i1,
                                      std::pair<int, Point> const& i2) {
    if (i1.first != -1 && i2.first != -1)
      return distance(ray.a, i1.second) < distance(ray.a, i2.second);
    return i1.first != -1;
  };

  if (closerIntersectionCmp(sphereIntersection, planeIntersection))
    return processPixelOnSphere(ray.a, sphereIntersection.second,
                                config.spheres.cbegin() + sphereIntersection.first, recursionLevel);
  else
    return processPixelOnPlane(ray.a, planeIntersection.second,
                               config.planes.cbegin() + planeIntersection.first, recursionLevel);
}